

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paseto-v2-local-encrypt.c
# Opt level: O3

int main(void)

{
  char cVar1;
  char *pcVar2;
  void *__ptr;
  size_t sVar3;
  uint8_t key [32];
  undefined1 auStack_38 [40];
  
  cVar1 = paseto_init();
  if (cVar1 == '\0') {
    main_cold_1();
LAB_001012fb:
    main_cold_2();
  }
  else {
    pcVar2 = getenv("PASETO_V2_LOCAL_SECRET");
    cVar1 = paseto_v2_local_load_key_base64(auStack_38,pcVar2);
    if (cVar1 == '\0') goto LAB_001012fb;
    __ptr = malloc(0x10000);
    if (__ptr != (void *)0x0) {
      sVar3 = fread(__ptr,1,0xffff,_stdin);
      pcVar2 = (char *)paseto_v2_local_encrypt(__ptr,sVar3,auStack_38,0,0);
      free(__ptr);
      if (pcVar2 != (char *)0x0) {
        puts(pcVar2);
        paseto_free(pcVar2);
        return 0;
      }
      goto LAB_00101305;
    }
  }
  main_cold_4();
LAB_00101305:
  main_cold_3();
  halt_baddata();
}

Assistant:

int main() {
    if (!paseto_init()) {
        fprintf(stderr, "Failed to initialize libpaseto\n");
        exit(-1);
    }

    uint8_t key[paseto_v2_LOCAL_KEYBYTES];
	if (!paseto_v2_local_load_key_base64(key,
				getenv("PASETO_V2_LOCAL_SECRET"))) {
        perror("Failed to load key");
        exit(-1);
    }
    uint8_t *message = malloc(BUF_SIZE);
    if (!message) {
        perror("Failed to allocate input buffer");
        exit(-1);
    }
    size_t message_len = fread(message, 1, BUF_SIZE - 1, stdin);
    char *encrypted = paseto_v2_local_encrypt(
            message, message_len, key, NULL, 0);
	free(message);
    if (!encrypted) {
        perror("paseto_v2_local_encrypt failed");
        exit(-1);
    }
	puts(encrypted);
    paseto_free(encrypted);
}